

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

bool Catch::TestCaseTracking::operator==(NameAndLocation *lhs,NameAndLocationRef *rhs)

{
  bool bVar1;
  StringRef *in_RSI;
  long in_RDI;
  string *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  SourceLineInfo *other;
  SourceLineInfo *this;
  bool local_1;
  
  if (*(size_type *)(in_RDI + 0x28) == in_RSI[1].m_size) {
    StringRef::StringRef
              ((StringRef *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
    other = (SourceLineInfo *)in_RSI->m_start;
    this = (SourceLineInfo *)in_RSI->m_size;
    bVar1 = StringRef::operator==
                      ((StringRef *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                       *in_RSI);
    local_1 = false;
    if (bVar1) {
      local_1 = SourceLineInfo::operator==(this,other);
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool operator==( NameAndLocation const& lhs,
                                NameAndLocationRef const& rhs ) {
            // This is a very cheap check that should have a very high hit rate.
            // If we get to SourceLineInfo::operator==, we will redo it, but the
            // cost of repeating is trivial at that point (we will be paying
            // multiple strcmp/memcmps at that point).
            if ( lhs.location.line != rhs.location.line ) { return false; }
            return StringRef( lhs.name ) == rhs.name &&
                   lhs.location == rhs.location;
        }